

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

void __thiscall
ICM::Compiler::PreliminaryCompile::setDoNode(PreliminaryCompile *this,Node *node,VecElt *dolist)

{
  pointer *ppEVar1;
  NodeTable *pNVar2;
  pointer puVar3;
  pointer puVar4;
  iterator __position;
  tuple<ICM::ASTBase::Node_*,_std::default_delete<ICM::ASTBase::Node>_> node_00;
  pointer *__ptr;
  uint_t uVar5;
  Element e;
  Element local_38;
  
  pNVar2 = (this->super_AnalysisBase).Table;
  puVar3 = (pNVar2->
           super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = (pNVar2->
           super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  node_00.super__Tuple_impl<0UL,_ICM::ASTBase::Node_*,_std::default_delete<ICM::ASTBase::Node>_>.
  super__Head_base<0UL,_ICM::ASTBase::Node_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_ICM::ASTBase::Node_*,_std::default_delete<ICM::ASTBase::Node>_>)
       operator_new(0x20);
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::vector
            ((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)
             node_00.
             super__Tuple_impl<0UL,_ICM::ASTBase::Node_*,_std::default_delete<ICM::ASTBase::Node>_>.
             super__Head_base<0UL,_ICM::ASTBase::Node_*,_false>._M_head_impl,dolist);
  uVar5 = (long)puVar3 - (long)puVar4 >> 3;
  *(uint_t *)
   ((long)node_00.
          super__Tuple_impl<0UL,_ICM::ASTBase::Node_*,_std::default_delete<ICM::ASTBase::Node>_>.
          super__Head_base<0UL,_ICM::ASTBase::Node_*,_false>._M_head_impl + 0x18) = uVar5;
  local_38._0_8_ =
       node_00.
       super__Tuple_impl<0UL,_ICM::ASTBase::Node_*,_std::default_delete<ICM::ASTBase::Node>_>.
       super__Head_base<0UL,_ICM::ASTBase::Node_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>>,std::allocator<std::unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>>>>
  ::emplace_back<std::unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>>>
            ((vector<std::unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>>,std::allocator<std::unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>>>>
              *)(this->super_AnalysisBase).Table,
             (unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_> *)&local_38);
  if ((_Tuple_impl<0UL,_ICM::ASTBase::Node_*,_std::default_delete<ICM::ASTBase::Node>_>)
      local_38._0_8_ != (Node *)0x0) {
    std::default_delete<ICM::ASTBase::Node>::operator()
              ((default_delete<ICM::ASTBase::Node> *)&local_38,(Node *)local_38._0_8_);
  }
  local_38.field_0.type = 2;
  __position._M_current =
       (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
       super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.index = uVar5;
  if (__position._M_current ==
      (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
      super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>::
    _M_realloc_insert<ICM::ASTBase::Element_const&>
              ((vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>> *)node,
               __position,&local_38);
  }
  else {
    (__position._M_current)->field_0 = (anon_union_4_2_4727c1b0_for_Element_0)0x2;
    *(undefined4 *)&(__position._M_current)->field_0x4 = local_38._4_4_;
    (__position._M_current)->index = uVar5;
    ppEVar1 = &(node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
               super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  adjustNode(this,(Node *)node_00.
                          super__Tuple_impl<0UL,_ICM::ASTBase::Node_*,_std::default_delete<ICM::ASTBase::Node>_>
                          .super__Head_base<0UL,_ICM::ASTBase::Node_*,_false>._M_head_impl,1);
  return;
}

Assistant:

void setDoNode(Node &node, VecElt &dolist) {
				size_t id = Table.size();
				Node *p = new Node(id, std::move(dolist));
				Table.push_back(std::move(std::unique_ptr<Node>(p)));
				Element e = Element::Refer(id);
				node.push_back(e);
				adjustNode(*p, 1);
			}